

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O1

void addstr(lua_State *L,SBuf *sb,char *str,MSize len)

{
  MSize osz;
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = sb->n + len;
  osz = sb->sz;
  uVar4 = osz;
  if (osz < uVar1) {
    do {
      uVar4 = uVar4 * 2;
    } while (uVar4 < uVar1);
    pcVar2 = (char *)lj_mem_realloc(L,sb->buf,osz,uVar4);
    sb->buf = pcVar2;
    sb->sz = uVar4;
  }
  uVar4 = sb->n;
  pcVar2 = sb->buf;
  sb->n = uVar4 + len;
  if (len != 0) {
    uVar3 = 0;
    do {
      pcVar2[uVar3 + uVar4] = str[uVar3];
      uVar3 = uVar3 + 1;
    } while (len != uVar3);
  }
  return;
}

Assistant:

static void addstr(lua_State *L, SBuf *sb, const char *str, MSize len)
{
  char *p;
  MSize i;
  if (sb->n + len > sb->sz) {
    MSize sz = sb->sz * 2;
    while (sb->n + len > sz) sz = sz * 2;
    lj_str_resizebuf(L, sb, sz);
  }
  p = sb->buf + sb->n;
  sb->n += len;
  for (i = 0; i < len; i++) p[i] = str[i];
}